

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O2

Aig_Man_t * Aig_ManStart(int nNodesMax)

{
  ulong uVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Aig_MmFixed_t *p;
  Aig_Obj_t *Entry;
  Aig_Obj_t **ppAVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  
  iVar9 = 0x2717;
  if (0 < nNodesMax) {
    iVar9 = nNodesMax;
  }
  pAVar3 = (Aig_Man_t *)calloc(1,0x210);
  pAVar3->nTravIds = 1;
  pVVar4 = Vec_PtrAlloc(100);
  pAVar3->vCis = pVVar4;
  pVVar4 = Vec_PtrAlloc(100);
  pAVar3->vCos = pVVar4;
  pVVar4 = Vec_PtrAlloc(1000);
  pAVar3->vObjs = pVVar4;
  pVVar5 = Vec_PtrAlloc(100);
  pAVar3->vBufs = pVVar5;
  pVVar5 = Vec_PtrAlloc(4);
  pAVar3->unfold2_type_I = pVVar5;
  pVVar5 = Vec_PtrAlloc(4);
  pAVar3->unfold2_type_II = pVVar5;
  p = Aig_MmFixedStart(0x30,iVar9);
  pAVar3->pMemObjs = p;
  Entry = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p);
  (Entry->field_0).pNext = (Aig_Obj_t *)0x0;
  Entry->pFanin0 = (Aig_Obj_t *)0x0;
  Entry->pFanin1 = (Aig_Obj_t *)0x0;
  *(undefined8 *)&Entry->field_0x18 = 0;
  Entry->TravId = 0;
  Entry->Id = 0;
  (Entry->field_5).pData = (void *)0x0;
  Entry->Id = pVVar4->nSize;
  Vec_PtrPush(pVVar4,Entry);
  pAVar3->pConst1 = Entry;
  *(ulong *)&Entry->field_0x18 = *(ulong *)&Entry->field_0x18 & 0xfffffffffffffff0 | 9;
  pAVar3->nObjs[1] = 1;
  uVar7 = iVar9 - 1;
  do {
    do {
      uVar8 = uVar7 + 1;
      uVar2 = uVar7 & 1;
      uVar7 = uVar8;
    } while (uVar2 != 0);
    uVar10 = 3;
    do {
      iVar9 = (int)uVar10;
      if (uVar8 < (uint)(iVar9 * iVar9)) {
        pAVar3->nTableSize = uVar8;
        ppAVar6 = (Aig_Obj_t **)calloc(1,(long)(int)uVar8 << 3);
        pAVar3->pTable = ppAVar6;
        return pAVar3;
      }
      uVar1 = (ulong)uVar8 % uVar10;
      uVar10 = (ulong)(iVar9 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description [The argument of this procedure is a soft limit on the
  the number of nodes, or 0 if the limit is unknown.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Aig_ManStart( int nNodesMax )
{
    Aig_Man_t * p;
    if ( nNodesMax <= 0 )
        nNodesMax = 10007;
    // start the manager
    p = ABC_ALLOC( Aig_Man_t, 1 );
    memset( p, 0, sizeof(Aig_Man_t) );
    // perform initializations
    p->nTravIds = 1;
    p->fCatchExor = 0;
    // allocate arrays for nodes
    p->vCis  = Vec_PtrAlloc( 100 );
    p->vCos  = Vec_PtrAlloc( 100 );
    p->vObjs = Vec_PtrAlloc( 1000 );
    p->vBufs = Vec_PtrAlloc( 100 );
    //--jlong -- begin
       p->unfold2_type_I = Vec_PtrAlloc( 4);
       p->unfold2_type_II = Vec_PtrAlloc( 4);
       //--jlong -- end
    // prepare the internal memory manager
    p->pMemObjs = Aig_MmFixedStart( sizeof(Aig_Obj_t), nNodesMax );
    // create the constant node
    p->pConst1 = Aig_ManFetchMemory( p );
    p->pConst1->Type = AIG_OBJ_CONST1;
    p->pConst1->fPhase = 1;
    p->nObjs[AIG_OBJ_CONST1]++;
    // start the table
    p->nTableSize = Abc_PrimeCudd( nNodesMax );
    p->pTable = ABC_ALLOC( Aig_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    return p;
}